

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall
FIX::Message::Message
          (Message *this,message_order *hdrOrder,message_order *trlOrder,message_order *order)

{
  message_order *order_local;
  message_order *trlOrder_local;
  message_order *hdrOrder_local;
  Message *this_local;
  
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_0030c368;
  Header::Header(&this->m_header,hdrOrder);
  Trailer::Trailer(&this->m_trailer,trlOrder);
  this->m_validStructure = true;
  return;
}

Assistant:

Message::Message(const message_order &hdrOrder, const message_order &trlOrder, const message_order& order)
: FieldMap(order), m_header(hdrOrder),
  m_trailer(trlOrder), m_validStructure( true ) {}